

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuTableType(sqlite3rbu *p,char *zTab,int *peType,int *piTnum,int *piPk)

{
  sqlite3 *psVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint local_6c;
  uint i;
  u8 *zIdx;
  u8 *zOrig;
  sqlite3_stmt *aStmt [4];
  int *piPk_local;
  int *piTnum_local;
  int *peType_local;
  char *zTab_local;
  sqlite3rbu *p_local;
  
  memset(&zOrig,0,0x20);
  *peType = 0;
  *piPk = 0;
  psVar1 = p->dbMain;
  pcVar3 = sqlite3_mprintf("SELECT (sql LIKE \'create virtual%%\'), rootpage  FROM sqlite_master WHERE name=%Q"
                           ,zTab);
  iVar2 = prepareFreeAndCollectError(psVar1,(sqlite3_stmt **)&zOrig,&p->zErrmsg,pcVar3);
  p->rc = iVar2;
  if ((p->rc == 0) && (iVar2 = sqlite3_step((sqlite3_stmt *)zOrig), iVar2 == 100)) {
    iVar2 = sqlite3_column_int((sqlite3_stmt *)zOrig,0);
    if (iVar2 == 0) {
      iVar2 = sqlite3_column_int((sqlite3_stmt *)zOrig,1);
      *piTnum = iVar2;
      psVar1 = p->dbMain;
      pcVar3 = sqlite3_mprintf("PRAGMA index_list=%Q",zTab);
      iVar2 = prepareFreeAndCollectError(psVar1,aStmt,&p->zErrmsg,pcVar3);
      p->rc = iVar2;
      if (p->rc == 0) {
        do {
          iVar2 = sqlite3_step(aStmt[0]);
          if (iVar2 != 100) {
            psVar1 = p->dbMain;
            pcVar3 = sqlite3_mprintf("PRAGMA table_info=%Q",zTab);
            iVar2 = prepareFreeAndCollectError(psVar1,aStmt + 2,&p->zErrmsg,pcVar3);
            p->rc = iVar2;
            if (p->rc != 0) goto LAB_0021dfa4;
            goto LAB_0021df69;
          }
          puVar4 = sqlite3_column_text(aStmt[0],3);
          puVar5 = sqlite3_column_text(aStmt[0],1);
        } while (((puVar4 == (uchar *)0x0) || (puVar5 == (uchar *)0x0)) || (*puVar4 != 'p'));
        psVar1 = p->dbMain;
        pcVar3 = sqlite3_mprintf("SELECT rootpage FROM sqlite_master WHERE name = %Q",puVar5);
        iVar2 = prepareFreeAndCollectError(psVar1,aStmt + 1,&p->zErrmsg,pcVar3);
        p->rc = iVar2;
        if (p->rc == 0) {
          iVar2 = sqlite3_step(aStmt[1]);
          if (iVar2 == 100) {
            iVar2 = sqlite3_column_int(aStmt[1],0);
            *piPk = iVar2;
            *peType = 3;
          }
          else {
            *peType = 4;
          }
        }
      }
    }
    else {
      *peType = 5;
    }
  }
  goto LAB_0021dfa4;
  while (iVar2 = sqlite3_column_int(aStmt[2],5), iVar2 < 1) {
LAB_0021df69:
    iVar2 = sqlite3_step(aStmt[2]);
    if (iVar2 != 100) {
      *peType = 1;
      goto LAB_0021dfa4;
    }
  }
  *peType = 2;
LAB_0021dfa4:
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    rbuFinalize(p,aStmt[(ulong)local_6c - 1]);
  }
  return;
}

Assistant:

static void rbuTableType(
  sqlite3rbu *p,
  const char *zTab,
  int *peType,
  int *piTnum,
  int *piPk
){
  /*
  ** 0) SELECT count(*) FROM sqlite_master where name=%Q AND IsVirtual(%Q)
  ** 1) PRAGMA index_list = ?
  ** 2) SELECT count(*) FROM sqlite_master where name=%Q 
  ** 3) PRAGMA table_info = ?
  */
  sqlite3_stmt *aStmt[4] = {0, 0, 0, 0};

  *peType = RBU_PK_NOTABLE;
  *piPk = 0;

  assert( p->rc==SQLITE_OK );
  p->rc = prepareFreeAndCollectError(p->dbMain, &aStmt[0], &p->zErrmsg, 
    sqlite3_mprintf(
          "SELECT (sql LIKE 'create virtual%%'), rootpage"
          "  FROM sqlite_master"
          " WHERE name=%Q", zTab
  ));
  if( p->rc!=SQLITE_OK || sqlite3_step(aStmt[0])!=SQLITE_ROW ){
    /* Either an error, or no such table. */
    goto rbuTableType_end;
  }
  if( sqlite3_column_int(aStmt[0], 0) ){
    *peType = RBU_PK_VTAB;                     /* virtual table */
    goto rbuTableType_end;
  }
  *piTnum = sqlite3_column_int(aStmt[0], 1);

  p->rc = prepareFreeAndCollectError(p->dbMain, &aStmt[1], &p->zErrmsg, 
    sqlite3_mprintf("PRAGMA index_list=%Q",zTab)
  );
  if( p->rc ) goto rbuTableType_end;
  while( sqlite3_step(aStmt[1])==SQLITE_ROW ){
    const u8 *zOrig = sqlite3_column_text(aStmt[1], 3);
    const u8 *zIdx = sqlite3_column_text(aStmt[1], 1);
    if( zOrig && zIdx && zOrig[0]=='p' ){
      p->rc = prepareFreeAndCollectError(p->dbMain, &aStmt[2], &p->zErrmsg, 
          sqlite3_mprintf(
            "SELECT rootpage FROM sqlite_master WHERE name = %Q", zIdx
      ));
      if( p->rc==SQLITE_OK ){
        if( sqlite3_step(aStmt[2])==SQLITE_ROW ){
          *piPk = sqlite3_column_int(aStmt[2], 0);
          *peType = RBU_PK_EXTERNAL;
        }else{
          *peType = RBU_PK_WITHOUT_ROWID;
        }
      }
      goto rbuTableType_end;
    }
  }

  p->rc = prepareFreeAndCollectError(p->dbMain, &aStmt[3], &p->zErrmsg, 
    sqlite3_mprintf("PRAGMA table_info=%Q",zTab)
  );
  if( p->rc==SQLITE_OK ){
    while( sqlite3_step(aStmt[3])==SQLITE_ROW ){
      if( sqlite3_column_int(aStmt[3],5)>0 ){
        *peType = RBU_PK_IPK;                /* explicit IPK column */
        goto rbuTableType_end;
      }
    }
    *peType = RBU_PK_NONE;
  }

rbuTableType_end: {
    unsigned int i;
    for(i=0; i<sizeof(aStmt)/sizeof(aStmt[0]); i++){
      rbuFinalize(p, aStmt[i]);
    }
  }
}